

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2ebd::InputSourcePreprocessing::Get
          (InputSourcePreprocessing *this,vector<double,_std::allocator<double>_> *buffer)

{
  int iVar1;
  ulong uVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int i_2;
  double *mean;
  int i_1;
  double *variance_1;
  int i;
  double *variance;
  int local_44;
  int local_34;
  int local_24;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))(*(long **)(in_RDI + 0x10),in_RSI);
    if ((uVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      iVar1 = *(int *)(in_RDI + 8);
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)*(int *)(in_RDI + 0xc));
          for (local_24 = 0; local_24 < *(int *)(in_RDI + 0xc); local_24 = local_24 + 1) {
            pvVar3[local_24] = 1.0 / pvVar3[local_24];
          }
        }
        else if (iVar1 == 2) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)*(int *)(in_RDI + 0xc));
          for (local_34 = 0; local_34 < *(int *)(in_RDI + 0xc); local_34 = local_34 + 1) {
            pvVar3[local_34] = 1.0 / pvVar3[local_34];
          }
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
          for (local_44 = 0; local_44 < *(int *)(in_RDI + 0xc); local_44 = local_44 + 1) {
            pvVar4[local_44] = pvVar3[local_44] * pvVar4[local_44];
          }
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Get(std::vector<double>* buffer) override {
    if (!is_valid_) {
      return false;
    }
    if (!source_->Get(buffer)) {
      return false;
    }
    switch (input_format_) {
      case kMeanAndVariance: {
        // Nothing to do.
        break;
      }
      case kMeanAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        break;
      }
      case kMeanTimesPrecisionAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        double* mean(&((*buffer)[0]));
        for (int i(0); i < half_read_size_; ++i) {
          mean[i] *= variance[i];
        }
        break;
      }
      default: {
        break;
      }
    }
    return true;
  }